

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::debugReportRowPrice
          (HighsSparseMatrix *this,HighsInt iRow,double multiplier,HighsInt to_iEl,
          HighsSparseVectorSum *sum)

{
  uint index;
  pointer pHVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (((multiplier != 0.0) || (NAN(multiplier))) &&
     ((this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iRow] < to_iEl)) {
    printf("Row %d: value = %11.4g",multiplier,(ulong)(uint)iRow);
    iVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iRow];
    lVar4 = (long)iVar3;
    if (iVar3 < to_iEl) {
      iVar3 = to_iEl - iVar3;
      iVar5 = 0;
      uVar2 = 0;
      do {
        index = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        HighsSparseVectorSum::add
                  (sum,index,
                   (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4] * multiplier);
        if ((int)(uVar2 / 5) * 5 + iVar5 == 0) {
          putchar(10);
        }
        pHVar1 = (sum->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        printf("[%4d %11.4g] ",pHVar1[(int)index].hi + pHVar1[(int)index].lo,(ulong)index);
        uVar2 = (ulong)((int)uVar2 + 1);
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void HighsSparseMatrix::debugReportRowPrice(const HighsInt iRow,
                                            const double multiplier,
                                            const HighsInt to_iEl,
                                            HighsSparseVectorSum& sum) const {
  if (this->start_[iRow] >= to_iEl) return;
  if (!multiplier) return;
  printf("Row %d: value = %11.4g", (int)iRow, multiplier);
  HighsInt num_print = 0;
  for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
    HighsInt iCol = this->index_[iEl];
    sum.add(iCol, multiplier * this->value_[iEl]);
    if (num_print % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)(iCol), sum.getValue(iCol));
    num_print++;
  }
  printf("\n");
}